

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::CheckSignature(TypeChecker *this,TypeVector *sig,char *desc)

{
  Result RVar1;
  pointer pTVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  
  pTVar2 = (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar2;
  if (lVar4 == 0) {
    RVar1.enum_ = Ok;
  }
  else {
    uVar5 = lVar4 >> 3;
    iVar3 = -1;
    uVar6 = 0;
    bVar7 = 0;
    do {
      RVar1 = PeekAndCheckType(this,(int)uVar5 + iVar3,pTVar2[uVar6]);
      bVar7 = bVar7 | RVar1.enum_ == Error;
      uVar6 = uVar6 + 1;
      pTVar2 = (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (long)(sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pTVar2 >> 3;
      iVar3 = iVar3 + -1;
    } while (uVar6 < uVar5);
    RVar1.enum_ = (Enum)bVar7;
  }
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_48,sig);
  if (RVar1.enum_ != Ok) {
    PrintStackIfFailedV(this,RVar1,desc,&local_48,false);
  }
  if (local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckSignature(const TypeVector& sig, const char* desc) {
  Result result = Result::Ok;
  for (size_t i = 0; i < sig.size(); ++i) {
    result |= PeekAndCheckType(sig.size() - i - 1, sig[i]);
  }
  PrintStackIfFailed(result, desc, sig);
  return result;
}